

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::MergeImported(BasicSceneBuilder *this,BasicSceneBuilder *imported)

{
  long lVar1;
  span<pbrt::ShapeSceneEntity> s;
  span<pbrt::InstanceSceneEntity> in;
  bool bVar2;
  __int_type_conflict1 _Var3;
  long in_RSI;
  vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_> *in_RDI;
  anon_class_8_1_8991fb9c mergeSet;
  lock_guard<std::mutex> lock;
  ActiveInstanceDefinition *parent;
  ActiveInstanceDefinition *current;
  anon_class_1_0_00000001 mergeVector;
  mutex_type *in_stack_ffffffffffffff18;
  ParserTarget *in_stack_ffffffffffffff20;
  InstanceDefinitionSceneEntity *this_00;
  vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>
  *in_stack_ffffffffffffff28;
  void *pvVar4;
  span<pbrt::ShapeSceneEntity> *in_stack_ffffffffffffff30;
  vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
  *in_stack_ffffffffffffff48;
  InternedString in_stack_ffffffffffffff50;
  InstanceDefinitionSceneEntity *in_stack_ffffffffffffff58;
  BasicScene *in_stack_ffffffffffffff60;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  pointer in_stack_ffffffffffffff78;
  LogLevel in_stack_ffffffffffffff84;
  
  while( true ) {
    bVar2 = std::
            vector<pbrt::BasicSceneBuilder::GraphicsState,_std::allocator<pbrt::BasicSceneBuilder::GraphicsState>_>
            ::empty((vector<pbrt::BasicSceneBuilder::GraphicsState,_std::allocator<pbrt::BasicSceneBuilder::GraphicsState>_>
                     *)in_stack_ffffffffffffff30);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ParserTarget::ErrorExitDeferred<>(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    std::
    vector<pbrt::BasicSceneBuilder::GraphicsState,_std::allocator<pbrt::BasicSceneBuilder::GraphicsState>_>
    ::pop_back((vector<pbrt::BasicSceneBuilder::GraphicsState,_std::allocator<pbrt::BasicSceneBuilder::GraphicsState>_>
                *)0x8488a5);
  }
  *(bool *)&(in_RDI->
            super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
            )._M_impl.super__Vector_impl_data._M_finish =
       ((ulong)(in_RDI->
               super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
               )._M_impl.super__Vector_impl_data._M_finish & 1) != 0 ||
       (*(byte *)(in_RSI + 8) & 1) != 0;
  bVar2 = std::vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>::empty
                    ((vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)
                     in_stack_ffffffffffffff30);
  if (!bVar2) {
    pstd::span<pbrt::ShapeSceneEntity>::span<pbrt::ShapeSceneEntity>
              (in_stack_ffffffffffffff30,
               (vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)
               in_stack_ffffffffffffff28);
    s.n._0_4_ = in_stack_ffffffffffffff70;
    s.ptr = (ShapeSceneEntity *)in_stack_ffffffffffffff68;
    s.n._4_4_ = in_stack_ffffffffffffff74;
    BasicScene::AddShapes(in_stack_ffffffffffffff60,s);
  }
  bVar2 = std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::empty
                    ((vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>
                      *)in_stack_ffffffffffffff30);
  if (!bVar2) {
    pstd::span<pbrt::InstanceSceneEntity>::span<pbrt::InstanceSceneEntity>
              ((span<pbrt::InstanceSceneEntity> *)
               (in_RDI->
               super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage,in_stack_ffffffffffffff28);
    in.n._0_4_ = in_stack_ffffffffffffff70;
    in.ptr = (InstanceSceneEntity *)in_stack_ffffffffffffff68;
    in.n._4_4_ = in_stack_ffffffffffffff74;
    BasicScene::AddInstanceUses(in_stack_ffffffffffffff60,in);
  }
  if (*(long *)(in_RSI + 0x5f0) != 0) {
    pvVar4 = *(void **)(in_RSI + 0x5f0);
    lVar1 = *(long *)((long)pvVar4 + 0x80);
    if (lVar1 == 0) {
      LogFatal<char_const(&)[18]>
                (in_stack_ffffffffffffff84,(char *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff74,(char *)in_stack_ffffffffffffff68,
                 (char (*) [18])in_stack_ffffffffffffff60);
    }
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    MergeImported(pbrt::BasicSceneBuilder*)::$_0::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff50.str,
               (vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)
               in_stack_ffffffffffffff48,
               (vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)in_RDI);
    MergeImported(pbrt::BasicSceneBuilder*)::$_0::operator()
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff50.str,in_stack_ffffffffffffff48,
               in_RDI);
    if (pvVar4 != (void *)0x0) {
      ActiveInstanceDefinition::~ActiveInstanceDefinition((ActiveInstanceDefinition *)0x848a7f);
      operator_delete(pvVar4,0x88);
    }
    _Var3 = std::__atomic_base<int>::operator--((__atomic_base<int> *)(lVar1 + 0x28));
    if (_Var3 == 0) {
      this_00 = (InstanceDefinitionSceneEntity *)&stack0xffffffffffffff50;
      InstanceDefinitionSceneEntity::InstanceDefinitionSceneEntity
                (this_00,(InstanceDefinitionSceneEntity *)
                         (in_RDI->
                         super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
                         )._M_impl.super__Vector_impl_data._M_end_of_storage);
      BasicScene::AddInstanceDefinition(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      InstanceDefinitionSceneEntity::~InstanceDefinitionSceneEntity(this_00);
    }
    std::mutex::unlock((mutex *)0x848b2b);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x848b3a);
  }
  MergeImported(pbrt::BasicSceneBuilder*)::$_1::operator()
            ((anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  MergeImported(pbrt::BasicSceneBuilder*)::$_1::operator()
            ((anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  MergeImported(pbrt::BasicSceneBuilder*)::$_1::operator()
            ((anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  return;
}

Assistant:

void BasicSceneBuilder::MergeImported(BasicSceneBuilder *imported) {
    while (!imported->pushedGraphicsStates.empty()) {
        ErrorExitDeferred("Missing end to AttributeBegin");
        imported->pushedGraphicsStates.pop_back();
    }

    errorExit |= imported->errorExit;

    if (!imported->shapes.empty())
        scene->AddShapes(imported->shapes);
    if (!imported->instanceUses.empty())
        scene->AddInstanceUses(imported->instanceUses);

    auto mergeVector = [](auto &base, auto &imported) {
        if (base.empty())
            base = std::move(imported);
        else {
            base.reserve(base.size() + imported.size());
            std::move(std::begin(imported), std::end(imported), std::back_inserter(base));
            imported.clear();
            imported.shrink_to_fit();
        }
    };
    if (imported->activeInstanceDefinition) {
        ActiveInstanceDefinition *current = imported->activeInstanceDefinition;
        ActiveInstanceDefinition *parent = current->parent;
        CHECK(parent != nullptr);

        std::lock_guard<std::mutex> lock(parent->mutex);
        mergeVector(parent->entity.shapes, current->entity.shapes);
        mergeVector(parent->entity.animatedShapes, current->entity.animatedShapes);

        delete current;

        if (--parent->activeImports == 0)
            scene->AddInstanceDefinition(std::move(parent->entity));

        parent->mutex.unlock();
    }

    auto mergeSet = [this](auto &base, auto &imported, const char *name) {
        for (const auto &item : imported) {
            if (base.find(item) != base.end())
                ErrorExitDeferred("%s: multiply defined %s.", item, name);
            base.insert(std::move(item));
        }
        imported.clear();
    };
    mergeSet(namedMaterialNames, imported->namedMaterialNames, "named material");
    mergeSet(floatTextureNames, imported->floatTextureNames, "texture");
    mergeSet(spectrumTextureNames, imported->spectrumTextureNames, "texture");
}